

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kprint.c
# Opt level: O2

void prindatum(LispPTR x)

{
  int iVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  long lVar4;
  LispPTR *pLVar5;
  uint uVar6;
  LispPTR LVar7;
  ulong uVar8;
  char *__format;
  
  pDVar2 = DTDspace;
  lVar4 = (long)Printdepth;
  if (PrintMaxLevel <= Printdepth) {
    if (Printdepth != PrintMaxLevel) {
      return;
    }
    if ((*(ushort *)((ulong)(x >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 5) {
      putchar(0x2a);
      return;
    }
    printf("(-)");
    return;
  }
  LVar7 = x & 0xfffffff;
  uVar6 = *(ushort *)((ulong)(x >> 8 & 0xffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  switch(uVar6) {
  case 1:
    if ((x & 0xfff0000) == 0xe0000) {
      uVar8 = (ulong)x & 0xffff;
      __format = "%d";
    }
    else {
      uVar8 = (ulong)(x | 0xffff0000);
      __format = "%d";
    }
    break;
  case 2:
    print_fixp(LVar7);
    return;
  case 3:
    print_floatp(LVar7);
    return;
  case 4:
  case 0x15:
    print_atomname(LVar7);
    return;
  case 5:
    Printdepth = Printdepth + 1;
    PrintLen[lVar4 + 1] = 0;
    putchar(0x28);
    do {
      iVar1 = PrintLen[Printdepth];
      PrintLen[Printdepth] = iVar1 + 1;
      if (PrintMaxLen < iVar1) {
LAB_00123aac:
        putchar(0x29);
        Printdepth = Printdepth + -1;
        return;
      }
      LVar3 = car(LVar7);
      prindatum(LVar3);
      pDVar2 = MDStypetbl;
      LVar3 = cdr(LVar7);
      if ((*(ushort *)((ulong)(pDVar2 + (LVar3 >> 9)) ^ 2) & 0x7ff) != 5) {
        LVar7 = cdr(LVar7);
        if (LVar7 != 0) {
          printf(" . ");
          prindatum(LVar7);
        }
        goto LAB_00123aac;
      }
      putchar(0x20);
      LVar7 = cdr(LVar7);
    } while( true );
  default:
    putchar(0x7b);
    uVar6 = *(uint *)((long)pDVar2 + (ulong)uVar6 * 4 + (ulong)(uVar6 << 5)) & 0xfffffff;
    if (uVar6 == 0) {
      printf("unknown");
    }
    else {
      print_atomname(uVar6);
    }
    printf("}0x");
    __format = "%x";
    uVar8 = (ulong)LVar7;
    break;
  case 7:
    print_string(LVar7);
    return;
  case 0xe:
  case 0x10:
    pLVar5 = NativeAligned4FromLAddr(LVar7);
    if ((*(byte *)((long)pLVar5 + 7) & 0x10) == 0) {
      return;
    }
    print_NEWstring(LVar7);
    return;
  }
  printf(__format,uVar8);
  return;
}

Assistant:

void prindatum(LispPTR x) {
  NEWSTRINGP *newstring;
  struct dtd *dtd_base;
  int typen;
  LispPTR typename;

  if (Printdepth >= PrintMaxLevel) {
    if (Printdepth == PrintMaxLevel) {
      if (GetTypeNumber(x) == TYPE_LISTP) {
        printf("(-)");
      } else
        printf("*");
    }
    return;
  }

  x = x & POINTERMASK;
  switch (typen = GetTypeNumber(x)) {
    case TYPE_LITATOM:
#ifdef BIGATOMS
    case TYPE_NEWATOM:
#endif /* BIGATOMS */
      print_atomname(x);
      break;
    case TYPE_LISTP:
      Printdepth++;
      PrintLen[Printdepth] = 0;
      printf("%c", LEFT_PAREN); /* print "(" */
    lp:
      if (PrintLen[Printdepth]++ > PrintMaxLen) {
        printf("%c", RIGHT_PAREN);
        Printdepth--;
        break;
      }
      prindatum(car(x));
      if (Listp(cdr(x)) == 0) { /* print dotted pair */
        if ((x = cdr(x)) != NIL) {
          printf(" . ");
          prindatum(x);
        }
      } else {
        printf("%c", SPACE);
        x = cdr(x);
        goto lp;
      }
      printf("%c", RIGHT_PAREN); /* print ")" */
      Printdepth--;
      break;

    case TYPE_SMALLP:
      if ((x & SEGMASK) == S_POSITIVE)
        printf("%d", LOLOC(x)); /* print positive smallp */
      else
        printf("%d", (LOLOC(x) | 0xffff0000)); /* print negative smallp */
      break;
    case TYPE_FIXP:
      print_fixp(x); /* print fixp  */
      break;
    case TYPE_FLOATP: print_floatp(x); break;
    case TYPE_STRINGP:
      print_string(x); /* print string */
      break;
    case TYPE_ONED_ARRAY:
    case TYPE_GENERAL_ARRAY:
      newstring = (NEWSTRINGP *)NativeAligned4FromLAddr(x);
      if (newstring->stringp) {
        print_NEWstring(x);
      }
      break;
    default: dtd_base = (struct dtd *)GetDTD(typen); printf("{");
#ifdef BIGVM
      if ((typename = dtd_base->dtd_name) != 0)
#else
      if ((typename = dtd_base->dtd_namelo + (dtd_base->dtd_namehi << 16)) != 0)
#endif
        print_atomname(typename);
      else
        printf("unknown");
      printf("}0x");
      printf("%x", x); /* print lisp address in hex */
  }
}